

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.cpp
# Opt level: O1

int main(void)

{
  initializer_list<int> __l;
  report rep;
  runner run;
  allocator_type local_d1;
  report local_d0;
  int local_b0 [2];
  runner local_a8;
  
  picobench::runner::runner(&local_a8,false);
  local_b0[0] = 100;
  local_b0[1] = 1000;
  __l._M_len = 2;
  __l._M_array = local_b0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_d0,__l,&local_d1);
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_a8._default_state_iterations,(vector<int,_std::allocator<int>_> *)&local_d0);
  if (local_d0.suites.
      super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.suites.
                    super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_a8._default_samples = 3;
  local_a8._compare_results_across_samples = true;
  local_a8._compare_results_across_benchmarks = true;
  picobench::runner::run_benchmarks(&local_a8,0x7b);
  picobench::runner::generate_report<std::equal_to<long>>(&local_d0,&local_a8);
  picobench::report::to_text(&local_d0,(ostream *)&std::cout);
  std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>::~vector
            (&local_d0.suites);
  if (local_a8._opts.
      super__Vector_base<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._opts.
                    super__Vector_base<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8._default_state_iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._default_state_iterations.super__Vector_base<int,_std::allocator<int>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::~vector
            (&local_a8.super_registry._suites);
  return local_a8._error;
}

Assistant:

int main()
{
    runner run;

#if defined(NDEBUG)
    run.set_default_state_iterations({ 20, 50, 100, 1000, 10000 });
    run.set_default_samples(10);
#else
    run.set_default_state_iterations({ 100, 1000 });
    run.set_default_samples(3);
#endif

    run.set_compare_results_across_benchmarks(true);
    run.set_compare_results_across_samples(true);

    run.run_benchmarks(123);
    
    auto rep = run.generate_report();

    rep.to_text(std::cout);

    return run.error();
}